

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall
CVmConsoleLog::CVmConsoleLog
          (CVmConsoleLog *this,CVmNetFile *nf,osfildef *fp,CCharmapToLocal *cmap,int width)

{
  byte bVar1;
  CVmFormatterLog *this_00;
  
  (this->super_CVmConsoleLogBase).super_CVmConsole.command_nf_ = (CVmNetFile *)0x0;
  (this->super_CVmConsoleLogBase).super_CVmConsole.command_glob_ = (vm_globalvar_t *)0x0;
  (this->super_CVmConsoleLogBase).super_CVmConsole.script_sp_ = (script_stack_entry *)0x0;
  (this->super_CVmConsoleLogBase).super_CVmConsole.command_fp_ = (CVmDataSource *)0x0;
  bVar1 = (this->super_CVmConsoleLogBase).super_CVmConsole.field_0x18;
  (this->super_CVmConsoleLogBase).super_CVmConsole.log_str_ = (CVmFormatterLog *)0x0;
  (this->super_CVmConsoleLogBase).super_CVmConsole.field_0x18 = bVar1 & 0xfc | 2;
  (this->super_CVmConsoleLogBase).super_CVmConsole._vptr_CVmConsole =
       (_func_int **)&PTR_delete_obj_0035b308;
  this_00 = (CVmFormatterLog *)operator_new(0xf060);
  (this_00->super_CVmFormatter).console_ = (CVmConsole *)this;
  (this_00->super_CVmFormatter).tabs_ = (CVmHashTable *)0x0;
  (this_00->super_CVmFormatter).cmap_ = (CCharmapToLocal *)0x0;
  (this_00->super_CVmFormatter).html_title_buf_ = (char *)0x0;
  (this_00->super_CVmFormatter).html_title_buf_size_ = 0;
  (this_00->super_CVmFormatter)._vptr_CVmFormatter = (_func_int **)&PTR_delete_obj_0035b470;
  this_00->logglob_ = (vm_globalvar_t *)0x0;
  this_00->logfp_ = (osfildef *)0x0;
  this_00->lognf_ = (CVmNetFile *)0x0;
  this_00->width_ = width;
  (this->super_CVmConsoleLogBase).super_CVmConsole.disp_str_ = (CVmFormatter *)this_00;
  CVmFormatterLog::set_log_file(this_00,nf,fp);
  CVmFormatter::set_charmap((CVmFormatter *)this_00,cmap);
  return;
}

Assistant:

CVmConsoleLog::CVmConsoleLog(VMG_ CVmNetFile *nf, osfildef *fp,
                             class CCharmapToLocal *cmap, int width)
{
    CVmFormatterLog *str;

    /* create our display stream */
    disp_str_ = str = new CVmFormatterLog(this, width);

    /* set the file */
    str->set_log_file(vmg_ nf, fp);

    /* set the character mapper */
    str->set_charmap(cmap);
}